

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

bool __thiscall duckdb::LogicalType::IsJSONType(LogicalType *this)

{
  bool bVar1;
  string local_30;
  
  if ((this->id_ == VARCHAR) && (bVar1 = HasAlias(this), bVar1)) {
    GetAlias_abi_cxx11_(&local_30,this);
    bVar1 = ::std::operator==(&local_30,"JSON");
    ::std::__cxx11::string::~string((string *)&local_30);
    return bVar1;
  }
  return false;
}

Assistant:

bool LogicalType::IsJSONType() const {
	return id() == LogicalTypeId::VARCHAR && HasAlias() && GetAlias() == JSON_TYPE_NAME;
}